

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Attribute_PDU::ClearAttributeRecordSet(Attribute_PDU *this)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  pAVar1 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      (**(pAVar3->super_DataTypeBase)._vptr_DataTypeBase)(pAVar3);
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar2);
    (this->m_vAttributeRecordSets).
    super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  return;
}

Assistant:

void Attribute_PDU::ClearAttributeRecordSet()
{
    // Reset the pdu length
    m_ui16PDULength = ATTRIBUTE_PDU_SIZE;
    m_vAttributeRecordSets.clear();
}